

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O2

void __thiscall ncnn::Option::Option(Option *this)

{
  int iVar1;
  
  this->lightmode = true;
  this->use_shader_pack8 = false;
  this->use_subgroup_ops = false;
  this->use_reserved_0 = false;
  iVar1 = get_physical_big_cpu_count();
  this->num_threads = iVar1;
  this->blob_allocator = (Allocator *)0x0;
  this->workspace_allocator = (Allocator *)0x0;
  this->openmp_blocktime = 0x14;
  this->use_winograd_convolution = true;
  this->use_sgemm_convolution = true;
  this->use_int8_inference = true;
  this->use_vulkan_compute = false;
  this->use_bf16_storage = false;
  this->use_fp16_packed = true;
  this->use_fp16_storage = true;
  this->use_fp16_arithmetic = true;
  this->use_int8_packed = true;
  this->use_int8_storage = true;
  this->use_int8_arithmetic = false;
  this->use_packing_layout = true;
  this->vulkan_device_index = -1;
  this->use_reserved_1 = false;
  this->use_image_storage = false;
  this->use_tensor_storage = false;
  this->use_reserved_2 = false;
  this->flush_denormals = 3;
  this->use_local_pool_allocator = true;
  this->use_shader_local_memory = true;
  this->use_cooperative_matrix = true;
  this->use_winograd23_convolution = true;
  this->use_winograd43_convolution = true;
  this->use_winograd63_convolution = true;
  iVar1 = is_current_thread_running_on_a53_a55();
  this->use_a53_a55_optimized_kernel = iVar1 != 0;
  this->use_fp16_uniform = true;
  this->use_int8_uniform = true;
  this->use_reserved_9 = false;
  this->use_reserved_10 = false;
  this->use_reserved_11 = false;
  return;
}

Assistant:

Option::Option()
{
    lightmode = true;
    use_shader_pack8 = false;
    use_subgroup_ops = false;
    use_reserved_0 = false;

    num_threads = get_physical_big_cpu_count();
    blob_allocator = 0;
    workspace_allocator = 0;

#if NCNN_VULKAN
    blob_vkallocator = 0;
    workspace_vkallocator = 0;
    staging_vkallocator = 0;
    pipeline_cache = 0;
#endif // NCNN_VULKAN

    openmp_blocktime = 20;

    use_winograd_convolution = true;
    use_sgemm_convolution = true;
    use_int8_inference = true;
    use_vulkan_compute = false; // TODO enable me

    use_bf16_storage = false;

    use_fp16_packed = true;
    use_fp16_storage = true;
    use_fp16_arithmetic = true;
    use_int8_packed = true;
    use_int8_storage = true;
    use_int8_arithmetic = false;

    use_packing_layout = true;

    vulkan_device_index = -1;
    use_reserved_1 = false;

    use_image_storage = false;
    use_tensor_storage = false;

    use_reserved_2 = false;

    flush_denormals = 3;

    use_local_pool_allocator = true;

    use_shader_local_memory = true;
    use_cooperative_matrix = true;

    use_winograd23_convolution = true;
    use_winograd43_convolution = true;
    use_winograd63_convolution = true;

    use_a53_a55_optimized_kernel = is_current_thread_running_on_a53_a55();

    use_fp16_uniform = true;
    use_int8_uniform = true;

    use_reserved_9 = false;
    use_reserved_10 = false;
    use_reserved_11 = false;
}